

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::onP2PStartConnect(Connection *this,P2PConnectParams *params)

{
  unsigned_short uVar1;
  long in_RSI;
  uint64_t in_RDI;
  P2PConnectParams startParams;
  uint64_t nowUsec;
  P2PConnectParams *in_stack_ffffffffffffff58;
  P2PConnectParams *in_stack_ffffffffffffff60;
  __int_type_conflict in_stack_ffffffffffffff68;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff70;
  long *plVar2;
  TimeSynchronizer *in_stack_ffffffffffffff80;
  Connection *in_stack_ffffffffffffff88;
  Counter<unsigned_short,_16U> local_62;
  undefined1 local_60 [24];
  uint64_t local_48;
  long local_20;
  uint64_t local_10;
  
  local_20 = in_RSI;
  protocol::P2PConnectParams::P2PConnectParams(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_10 = siamese::GetTimeUsec();
  std::__atomic_base<unsigned_long>::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Counter<unsigned_short,_16U>::Counter(&local_62,*(unsigned_short *)(local_20 + 0x12));
  local_48 = TimeSynchronizer::FromLocalTime16
                       (in_stack_ffffffffffffff80,in_RDI,(Counter16 *)in_stack_ffffffffffffff70);
  plVar2 = *(long **)(in_RDI + 0xd8);
  getSelfAddress(in_stack_ffffffffffffff88);
  uVar1 = asio::ip::basic_endpoint<asio::ip::udp>::port((basic_endpoint<asio::ip::udp> *)0x1acaf4);
  (**(code **)(*plVar2 + 0x10))(plVar2,uVar1,*(undefined4 *)(in_RDI + 0xc900),local_60);
  return;
}

Assistant:

void Connection::onP2PStartConnect(const protocol::P2PConnectParams& params)
{
    protocol::P2PConnectParams startParams = params;
    startParams.ShotTimeUsec = TimeSync.FromLocalTime16(GetTicksUsec(), params.ShotTS16);

    Deps.NATPool->OnP2PStartConnect(
        getSelfAddress().port(),
        LocallyAssignedIdForRemoteHost,
        startParams);
}